

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
userDefinedUnits_removeUserInputDefinition_Test::~userDefinedUnits_removeUserInputDefinition_Test
          (userDefinedUnits_removeUserInputDefinition_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, removeUserInputDefinition)
{
    precise_unit nidgit2(3.256, cd / m.pow(2));
    addUserDefinedInputUnit("nidgitS", nidgit2);
    precise_unit nidgit3(3.256, cd / m.pow(3));
    addUserDefinedInputUnit("nidgitC", nidgit3);

    auto ipm = unit_from_string("$/nidgitS");
    EXPECT_EQ(ipm, precise::currency / nidgit2);

    auto ipm2 = unit_from_string("$/nidgitC");
    EXPECT_EQ(ipm2, precise::currency / nidgit3);

    removeUserDefinedUnit("nidgitS");
    EXPECT_NO_THROW(removeUserDefinedUnit("chaos"));

    auto ipm3 = unit_from_string("$/nidgitS");
    EXPECT_FALSE(is_valid(ipm3));

    auto ipm4 = unit_from_string("mol/nidgitC");
    EXPECT_EQ(ipm4, precise::mol / nidgit3);
}